

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O0

int readMPS(char *filename,int mxNumRow,int mxNumCol,int *numRow,int *numCol,int *objSense,
           double *objOffset,vector<int,_std::allocator<int>_> *Astart,
           vector<int,_std::allocator<int>_> *Aindex,vector<double,_std::allocator<double>_> *Avalue
           ,vector<double,_std::allocator<double>_> *colCost,
           vector<double,_std::allocator<double>_> *colLower,
           vector<double,_std::allocator<double>_> *colUpper,
           vector<double,_std::allocator<double>_> *rowLower,
           vector<double,_std::allocator<double>_> *rowUpper,
           vector<int,_std::allocator<int>_> *integerColumn)

{
  double dVar1;
  value_type vVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  uint *puVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  uint *in_RCX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  uint *in_R8;
  undefined4 *in_R9;
  double dVar12;
  undefined8 *in_stack_00000008;
  vector<int,_std::allocator<int>_> *in_stack_00000018;
  vector<double,_std::allocator<double>_> *in_stack_00000038;
  vector<double,_std::allocator<double>_> *in_stack_00000040;
  vector<double,_std::allocator<double>_> *in_stack_00000048;
  vector<int,_std::allocator<int>_> *in_stack_00000050;
  int iCol_1;
  int iCol;
  int iRow_2;
  int iRow_1;
  int iRow;
  vector<double,_std::allocator<double>_> RHS;
  double lastName;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> colIndex;
  double objName;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> rowIndex;
  vector<char,_std::allocator<char>_> rowType;
  int integerCol;
  double data [3];
  char flag [2];
  char line [128];
  int lmax;
  FILE *file;
  value_type_conflict1 *in_stack_fffffffffffffd18;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd20;
  allocator_type *in_stack_fffffffffffffd28;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  size_type in_stack_fffffffffffffd38;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd40;
  mapped_type *in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  key_type_conflict *in_stack_fffffffffffffd58;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
  *in_stack_fffffffffffffd60;
  FILE *in_stack_fffffffffffffd68;
  int local_1d8;
  int local_1c8;
  vector<double,_std::allocator<double>_> local_1b0;
  undefined4 local_198;
  undefined4 local_194;
  undefined8 local_190;
  double local_188;
  undefined4 local_150;
  double local_140;
  vector<char,_std::allocator<char>_> local_108;
  uint local_ec;
  double local_e8;
  double local_e0;
  double local_d8;
  char local_ca [142];
  undefined4 local_3c;
  FILE *local_38;
  uint *local_28;
  uint *local_20;
  int local_18;
  int local_14;
  char *local_10;
  int local_4;
  
  *in_RCX = 0;
  *in_R8 = 0;
  *in_stack_00000008 = 0;
  *in_R9 = 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1c659b);
  printf("readMPS: Trying to open file %s\n",local_10);
  local_38 = fopen(local_10,"r");
  if (local_38 == (FILE *)0x0) {
    printf("readMPS: Not opened file OK\n");
    local_4 = 1;
  }
  else {
    printf("readMPS: Opened file  OK\n");
    local_3c = 0x80;
    memset(local_ca,0,2);
    local_ec = 0;
    load_mpsLine(in_stack_fffffffffffffd68,(int *)in_stack_fffffffffffffd60,
                 (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                 (char *)in_stack_fffffffffffffd48,(double *)in_stack_fffffffffffffd40);
    load_mpsLine(in_stack_fffffffffffffd68,(int *)in_stack_fffffffffffffd60,
                 (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                 (char *)in_stack_fffffffffffffd48,(double *)in_stack_fffffffffffffd40);
    printf("readMPS: Read NAME    OK\n");
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0x1c66ad);
    std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::map
              ((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                *)0x1c66ba);
    local_140 = 0.0;
    while (bVar4 = load_mpsLine(in_stack_fffffffffffffd68,(int *)in_stack_fffffffffffffd60,
                                (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                                (char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50
                                                ),(char *)in_stack_fffffffffffffd48,
                                (double *)in_stack_fffffffffffffd40), bVar4) {
      if (((local_ca[0] != 'N') || (local_140 != 0.0)) || (NAN(local_140))) {
        if ((0 < local_14) && (local_14 <= (int)*local_20)) {
          local_4 = 2;
          local_150 = 1;
          goto LAB_001c74d4;
        }
        std::vector<char,_std::allocator<char>_>::push_back
                  (in_stack_fffffffffffffd30,(value_type_conflict2 *)in_stack_fffffffffffffd28);
        uVar3 = *local_20;
        *local_20 = uVar3 + 1;
        puVar6 = (uint *)std::
                         map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                         ::operator[](in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        *puVar6 = uVar3;
      }
      else {
        local_140 = local_e0;
      }
    }
    printf("readMPS: Read ROWS    OK\n");
    std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::map
              ((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                *)0x1c6818);
    local_188 = 0.0;
    while (bVar4 = load_mpsLine(in_stack_fffffffffffffd68,(int *)in_stack_fffffffffffffd60,
                                (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                                (char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50
                                                ),(char *)in_stack_fffffffffffffd48,
                                (double *)in_stack_fffffffffffffd40), bVar4) {
      if ((local_188 != local_e0) || (NAN(local_188) || NAN(local_e0))) {
        if ((0 < local_18) && (local_18 <= (int)*local_28)) {
          local_4 = 2;
          local_150 = 1;
          goto LAB_001c74b6;
        }
        local_188 = local_e0;
        uVar3 = *local_28;
        *local_28 = uVar3 + 1;
        puVar6 = (uint *)std::
                         map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                         ::operator[](in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        *puVar6 = uVar3;
        local_190 = 0;
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        sVar7 = std::vector<int,_std::allocator<int>_>::size(in_stack_00000018);
        local_194 = (undefined4)sVar7;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd20,
                   (value_type *)in_stack_fffffffffffffd18);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30,
                   (value_type *)in_stack_fffffffffffffd28);
      }
      dVar1 = local_e8;
      if ((local_d8 != local_140) || (NAN(local_d8) || NAN(local_140))) {
        if ((local_e8 != 0.0) || (NAN(local_e8))) {
          std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
          operator[](in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30,
                     (value_type *)in_stack_fffffffffffffd28);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd30,
                     (value_type_conflict1 *)in_stack_fffffffffffffd28);
        }
      }
      else {
        pvVar11 = std::vector<double,_std::allocator<double>_>::back(in_stack_fffffffffffffd20);
        *pvVar11 = dVar1;
      }
    }
    sVar7 = std::vector<int,_std::allocator<int>_>::size(in_stack_00000018);
    local_198 = (undefined4)sVar7;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd20,
               (value_type *)in_stack_fffffffffffffd18);
    printf("readMPS: Read COLUMNS OK\n");
    std::allocator<double>::allocator((allocator<double> *)0x1c6ae8);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               (value_type_conflict1 *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    std::allocator<double>::~allocator((allocator<double> *)0x1c6b1c);
    while (bVar4 = load_mpsLine(in_stack_fffffffffffffd68,(int *)in_stack_fffffffffffffd60,
                                (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                                (char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50
                                                ),(char *)in_stack_fffffffffffffd48,
                                (double *)in_stack_fffffffffffffd40), bVar4) {
      if ((local_d8 != local_140) || (NAN(local_d8) || NAN(local_140))) {
        pmVar8 = std::
                 map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                 ::operator[](in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        dVar1 = local_e8;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](&local_1b0,(long)*pmVar8)
        ;
        *pvVar11 = dVar1;
      }
      else {
        printf("RHS for N-row in MPS file implies objective offset of %g: ignoring this!\n",local_e8
              );
        *in_stack_00000008 = 0;
      }
    }
    printf("readMPS: Read RHS     OK\n");
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    if (local_ca[0] == 'R') {
      while (bVar4 = load_mpsLine(in_stack_fffffffffffffd68,(int *)in_stack_fffffffffffffd60,
                                  (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                                  (char *)CONCAT17(in_stack_fffffffffffffd57,
                                                   in_stack_fffffffffffffd50),
                                  (char *)in_stack_fffffffffffffd48,
                                  (double *)in_stack_fffffffffffffd40), bVar4) {
        pmVar8 = std::
                 map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                 ::operator[](in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        iVar5 = *pmVar8;
        pvVar9 = std::vector<char,_std::allocator<char>_>::operator[](&local_108,(long)iVar5);
        if ((*pvVar9 == 'L') ||
           ((pvVar9 = std::vector<char,_std::allocator<char>_>::operator[](&local_108,(long)iVar5),
            *pvVar9 == 'E' && (local_e8 < 0.0)))) {
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](&local_1b0,(long)iVar5)
          ;
          dVar1 = *pvVar11;
          dVar12 = ABS(local_e8);
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              (in_stack_00000040,(long)iVar5);
          *pvVar11 = dVar1 - dVar12;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](&local_1b0,(long)iVar5)
          ;
          vVar2 = *pvVar11;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              (in_stack_00000048,(long)iVar5);
          *pvVar11 = vVar2;
        }
        else {
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](&local_1b0,(long)iVar5)
          ;
          dVar1 = *pvVar11;
          dVar12 = ABS(local_e8);
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              (in_stack_00000048,(long)iVar5);
          *pvVar11 = dVar1 + dVar12;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](&local_1b0,(long)iVar5)
          ;
          vVar2 = *pvVar11;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              (in_stack_00000040,(long)iVar5);
          *pvVar11 = vVar2;
        }
        pvVar9 = std::vector<char,_std::allocator<char>_>::operator[](&local_108,(long)iVar5);
        *pvVar9 = 'X';
      }
    }
    for (local_1c8 = 0; local_1c8 < (int)*local_20; local_1c8 = local_1c8 + 1) {
      pvVar9 = std::vector<char,_std::allocator<char>_>::operator[](&local_108,(long)local_1c8);
      switch(*pvVar9) {
      case 'E':
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (&local_1b0,(long)local_1c8);
        in_stack_fffffffffffffd58 = (key_type_conflict *)*pvVar11;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (in_stack_00000040,(long)local_1c8);
        *pvVar11 = (value_type)in_stack_fffffffffffffd58;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (&local_1b0,(long)local_1c8);
        in_stack_fffffffffffffd60 =
             (map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> *)
             *pvVar11;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (in_stack_00000048,(long)local_1c8);
        *pvVar11 = (value_type)in_stack_fffffffffffffd60;
        break;
      case 'G':
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (&local_1b0,(long)local_1c8);
        in_stack_fffffffffffffd68 = (FILE *)*pvVar11;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (in_stack_00000040,(long)local_1c8);
        *pvVar11 = (value_type)in_stack_fffffffffffffd68;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (in_stack_00000048,(long)local_1c8);
        *pvVar11 = 1e+200;
        break;
      case 'L':
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (in_stack_00000040,(long)local_1c8);
        *pvVar11 = -1e+200;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (&local_1b0,(long)local_1c8);
        vVar2 = *pvVar11;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (in_stack_00000048,(long)local_1c8);
        *pvVar11 = vVar2;
        break;
      case 'N':
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (in_stack_00000040,(long)local_1c8);
        *pvVar11 = -1e+200;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (in_stack_00000048,(long)local_1c8);
        *pvVar11 = 1e+200;
        break;
      case 'X':
      }
    }
    printf("readMPS: Read RANGES  OK\n");
    std::vector<double,_std::allocator<double>_>::assign
              (in_stack_fffffffffffffd20,(size_type)in_stack_fffffffffffffd18,
               (value_type_conflict1 *)0x1c7117);
    std::vector<double,_std::allocator<double>_>::assign
              (in_stack_fffffffffffffd20,(size_type)in_stack_fffffffffffffd18,
               (value_type_conflict1 *)0x1c7138);
    if (local_ca[0] == 'B') {
      while (in_stack_fffffffffffffd57 =
                  load_mpsLine(in_stack_fffffffffffffd68,(int *)in_stack_fffffffffffffd60,
                               (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                               (char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50)
                               ,(char *)in_stack_fffffffffffffd48,
                               (double *)in_stack_fffffffffffffd40), (bool)in_stack_fffffffffffffd57
            ) {
        in_stack_fffffffffffffd48 =
             std::
             map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
             operator[](in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        in_stack_fffffffffffffd40 =
             (vector<double,_std::allocator<double>_> *)(ulong)((int)local_ca[0] - 0x49U);
        if ((int)local_ca[0] - 0x49U < 0x10) {
          iVar5 = (*(code *)(&DAT_001d0e00 +
                            *(int *)(&DAT_001d0e00 + (long)in_stack_fffffffffffffd40 * 4)))();
          return iVar5;
        }
      }
    }
    for (local_1d8 = 0; local_1d8 < (int)*local_28; local_1d8 = local_1d8 + 1) {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          (in_stack_00000050,(long)local_1d8);
      if (*pvVar10 != 0) {
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (in_stack_00000038,(long)local_1d8);
        if ((*pvVar11 == 1e+200) && (!NAN(*pvVar11))) {
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              (in_stack_00000038,(long)local_1d8);
          *pvVar11 = 1.0;
        }
      }
    }
    printf("readMPS: Read BOUNDS  OK\n");
    printf("readMPS: Read ENDATA  OK\n");
    printf("readMPS: Model has %d rows and %d columns with %d integer\n",(ulong)*local_20,
           (ulong)*local_28,(ulong)local_ec);
    fclose(local_38);
    local_4 = 0;
    local_150 = 1;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd30);
LAB_001c74b6:
    std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::~map
              ((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                *)0x1c74c3);
LAB_001c74d4:
    std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::~map
              ((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                *)0x1c74e1);
    std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffd30);
  }
  return local_4;
}

Assistant:

int readMPS(const char *filename, int mxNumRow, int mxNumCol,
	    int& numRow, int& numCol, int& objSense, double& objOffset,
	    vector<int>& Astart,  vector<int>& Aindex, vector<double>& Avalue,
	    vector<double>& colCost, vector<double>& colLower, vector<double>& colUpper,
	    vector<double>& rowLower, vector<double>& rowUpper,
	    vector<int>& integerColumn) {

    // MPS file buffer
    numRow = 0;
    numCol = 0;
    objOffset = 0;
    objSense = OBJSENSE_MINIMIZE;

    //Astart.clear() added since setting Astart.push_back(0) in
    //setup_clearModel() messes up the MPS read
    Astart.clear();
#ifdef JAJH_dev
    printf("readMPS: Trying to open file %s\n", filename);
#endif
    FILE *file = fopen(filename, "r");
    if (file == 0) {
#ifdef JAJH_dev
      printf("readMPS: Not opened file OK\n");
#endif
      return 1;
    }
#ifdef JAJH_dev
    printf("readMPS: Opened file  OK\n");
#endif
    // Input buffer
    const int lmax = 128;
    char line[lmax];
    char flag[2] = { 0, 0 };
    double data[3];

    int integerCol = 0;

    // Load NAME and ROWS
    load_mpsLine(file, integerCol, lmax, line, flag, data);
    load_mpsLine(file, integerCol, lmax, line, flag, data);
#ifdef JAJH_dev
    printf("readMPS: Read NAME    OK\n");
#endif

    vector<char> rowType;
    map<double, int> rowIndex;
    double objName = 0;
    while (load_mpsLine(file, integerCol, lmax, line, flag, data)) {
      if (flag[0] == 'N' && objName == 0) {
	objName = data[1];
      } else {
	if (mxNumRow>0 && numRow >= mxNumRow) return 2;
	rowType.push_back(flag[0]);
	rowIndex[data[1]] = numRow++;
      }
    }
#ifdef JAJH_dev
    printf("readMPS: Read ROWS    OK\n");
#endif

    // Load COLUMNS
    map<double, int> colIndex;
    double lastName = 0;
    while (load_mpsLine(file, integerCol, lmax, line, flag, data)) {
      if (lastName != data[1]) { // New column
	if (mxNumCol>0 && numCol >= mxNumCol) return 2;
	lastName = data[1];
	colIndex[data[1]] = numCol++;
	colCost.push_back(0);
	Astart.push_back(Aindex.size());
	integerColumn.push_back(integerCol);
      }
      if (data[2] == objName) // Cost
	colCost.back() = data[0];
      else if (data[0] != 0) {
	Aindex.push_back(rowIndex[data[2]]);
	Avalue.push_back(data[0]);
      }
    }
    Astart.push_back(Aindex.size());

#ifdef JAJH_dev
    printf("readMPS: Read COLUMNS OK\n");
#endif

    // Load RHS
    vector<double> RHS(numRow, 0);
    while (load_mpsLine(file, integerCol, lmax, line, flag, data)) {
        if (data[2] != objName) {
            int iRow = rowIndex[data[2]];
            RHS[iRow] = data[0];
        } else {
//        	Strictly, if there is a RHS entry for the N row, it is an objective offset
//        	However, the reported objective values for problems (eg e226) ignore this
#ifdef JAJH_dev
        	printf("RHS for N-row in MPS file implies objective offset of %g: ignoring this!\n", data[0]);
#endif
//            objOffset = data[0]; // Objective offset
            objOffset = 0;
        }
    }
#ifdef JAJH_dev
    printf("readMPS: Read RHS     OK\n");
#endif

    // Load RANGES
    rowLower.resize(numRow);
    rowUpper.resize(numRow);
    if (flag[0] == 'R') {
        while (load_mpsLine(file, integerCol, lmax, line, flag, data)) {
            int iRow = rowIndex[data[2]];
            if (rowType[iRow] == 'L' || (rowType[iRow] == 'E' && data[0] < 0)) {
                rowLower[iRow] = RHS[iRow] - fabs(data[0]);
                rowUpper[iRow] = RHS[iRow];
            } else {
                rowUpper[iRow] = RHS[iRow] + fabs(data[0]);
                rowLower[iRow] = RHS[iRow];
            }
            rowType[iRow] = 'X';
        }
    }

    // Setup bounds for row without 'RANGE'
    for (int iRow = 0; iRow < numRow; iRow++) {
        switch (rowType[iRow]) {
        case 'L':
            rowLower[iRow] = -HSOL_CONST_INF;
            rowUpper[iRow] = RHS[iRow];
            break;
        case 'G':
            rowLower[iRow] = RHS[iRow];
            rowUpper[iRow] = +HSOL_CONST_INF;
            break;
        case 'E':
            rowLower[iRow] = RHS[iRow];
            rowUpper[iRow] = RHS[iRow];
            break;
        case 'N':
            rowLower[iRow] = -HSOL_CONST_INF;
            rowUpper[iRow] = +HSOL_CONST_INF;
            break;
        case 'X':
            break;
        }
    }
#ifdef JAJH_dev
    printf("readMPS: Read RANGES  OK\n");
#endif

    // Load BOUNDS
    colLower.assign(numCol, 0);
    colUpper.assign(numCol, HSOL_CONST_INF);

    if (flag[0] == 'B') {
        while (load_mpsLine(file, integerCol, lmax, line, flag, data)) {
            int iCol = colIndex[data[2]];

            switch (flag[0]) {
            case 'O': /*LO*/
                colLower[iCol] = data[0];
                break;
            case 'I': /*MI*/
                colLower[iCol] = -HSOL_CONST_INF;
                break;
            case 'L': /*PL*/
                colUpper[iCol] = HSOL_CONST_INF;
                break;
            case 'X': /*FX*/
                colLower[iCol] = data[0];
                colUpper[iCol] = data[0];
                break;
            case 'R': /*FR*/
                colLower[iCol] = -HSOL_CONST_INF;
                colUpper[iCol] = HSOL_CONST_INF;
                break;
            case 'P': /*UP*/
                colUpper[iCol] = data[0];
                if (colLower[iCol] == 0 && data[0] < 0)
                    colLower[iCol] = -HSOL_CONST_INF;
                break;
            }
        }
    }

    //bounds of [0,1] for integer variables without bounds
    for (int iCol = 0; iCol < numCol; iCol++) {
      if (integerColumn[iCol]) {
	if (colUpper[iCol] == HSOL_CONST_INF)
	  colUpper[iCol] = 1;
      }
    }

#ifdef JAJH_dev
    printf("readMPS: Read BOUNDS  OK\n");
    printf("readMPS: Read ENDATA  OK\n");
    printf("readMPS: Model has %d rows and %d columns with %d integer\n", numRow, numCol, integerCol);
#endif
    // Load ENDATA and close file
    fclose(file);
    return 0;
}